

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t __thiscall
axl::err::Error::format_va(Error *this,Guid *guid,uint_t code,char *formatString,axl_va_list *va)

{
  long lVar1;
  undefined8 uVar2;
  size_t sVar3;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  axl_va_list *in_RDI;
  PackerSeq *in_R8;
  void *unaff_retaddr;
  PackerSeq *in_stack_00000008;
  size_t size;
  size_t packSize;
  PackerSeq packer;
  axl_va_list *in_stack_fffffffffffffee8;
  undefined4 local_b0;
  undefined1 in_stack_ffffffffffffff5f;
  size_t in_stack_ffffffffffffff60;
  Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef> *in_stack_ffffffffffffff68;
  long local_68;
  axl_va_list *va_00;
  size_t *in_stack_fffffffffffffff8;
  
  va_00 = in_RDI;
  sl::PackerSeq::PackerSeq(in_R8);
  sl::PackerSeq::format(in_R8,(char *)in_stack_fffffffffffffee8);
  axl_va_list::axl_va_list((axl_va_list *)in_R8,in_stack_fffffffffffffee8);
  sl::PackerSeq::pack_va(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,va_00);
  axl_va_list::~axl_va_list((axl_va_list *)0x17b87c);
  axl_va_list::~axl_va_list((axl_va_list *)0x17b886);
  sVar3 = local_68 + 0x18;
  rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  if (*(long *)in_RDI == 0) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    local_b0 = (undefined4)sVar3;
    **(undefined4 **)in_RDI = local_b0;
    lVar1 = *(long *)in_RDI;
    uVar2 = in_RSI[1];
    *(undefined8 *)(lVar1 + 4) = *in_RSI;
    *(undefined8 *)(lVar1 + 0xc) = uVar2;
    *(undefined4 *)(*(long *)in_RDI + 0x14) = in_EDX;
    axl_va_list::axl_va_list((axl_va_list *)in_R8,(axl_va_list *)(*(long *)in_RDI + 0x18));
    sl::PackerSeq::pack_va(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,va_00);
    axl_va_list::~axl_va_list((axl_va_list *)0x17b982);
    axl_va_list::~axl_va_list((axl_va_list *)0x17b98c);
  }
  sl::PackerSeq::~PackerSeq((PackerSeq *)0x17b9d0);
  return sVar3;
}

Assistant:

size_t
Error::format_va(
	const sl::Guid& guid,
	uint_t code,
	const char* formatString,
	axl_va_list va
) {
	sl::PackerSeq packer;
	packer.format(formatString);

	size_t packSize;
	packer.pack_va(NULL, &packSize, va);

	size_t size = sizeof(ErrorHdr) + packSize;

	createBuffer(size);
	if (!m_p)
		return -1;

	m_p->m_size = (uint32_t)size;
	m_p->m_guid = guid;
	m_p->m_code = code;

	packer.pack_va(m_p + 1, &packSize, va);
	return size;
}